

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHingeConstraint.cpp
# Opt level: O1

void __thiscall
btHingeConstraint::btHingeConstraint
          (btHingeConstraint *this,btRigidBody *rbA,btTransform *rbAFrame,bool useReferenceFrameA)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  btRigidBody *pbVar5;
  undefined1 auVar6 [16];
  undefined3 in_register_00000009;
  btScalar bVar7;
  
  btTypedConstraint::btTypedConstraint(&this->super_btTypedConstraint,HINGE_CONSTRAINT_TYPE,rbA);
  (this->super_btTypedConstraint)._vptr_btTypedConstraint =
       (_func_int **)&PTR__btTypedConstraint_002282b0;
  uVar4 = *(undefined8 *)((rbAFrame->m_basis).m_el[0].m_floats + 2);
  *(undefined8 *)(this->m_rbAFrame).m_basis.m_el[0].m_floats =
       *(undefined8 *)(rbAFrame->m_basis).m_el[0].m_floats;
  *(undefined8 *)((this->m_rbAFrame).m_basis.m_el[0].m_floats + 2) = uVar4;
  uVar4 = *(undefined8 *)((rbAFrame->m_basis).m_el[1].m_floats + 2);
  *(undefined8 *)(this->m_rbAFrame).m_basis.m_el[1].m_floats =
       *(undefined8 *)(rbAFrame->m_basis).m_el[1].m_floats;
  *(undefined8 *)((this->m_rbAFrame).m_basis.m_el[1].m_floats + 2) = uVar4;
  uVar4 = *(undefined8 *)((rbAFrame->m_basis).m_el[2].m_floats + 2);
  *(undefined8 *)(this->m_rbAFrame).m_basis.m_el[2].m_floats =
       *(undefined8 *)(rbAFrame->m_basis).m_el[2].m_floats;
  *(undefined8 *)((this->m_rbAFrame).m_basis.m_el[2].m_floats + 2) = uVar4;
  uVar4 = *(undefined8 *)((rbAFrame->m_origin).m_floats + 2);
  *(undefined8 *)(this->m_rbAFrame).m_origin.m_floats = *(undefined8 *)(rbAFrame->m_origin).m_floats
  ;
  *(undefined8 *)((this->m_rbAFrame).m_origin.m_floats + 2) = uVar4;
  uVar4 = *(undefined8 *)((rbAFrame->m_basis).m_el[0].m_floats + 2);
  *(undefined8 *)(this->m_rbBFrame).m_basis.m_el[0].m_floats =
       *(undefined8 *)(rbAFrame->m_basis).m_el[0].m_floats;
  *(undefined8 *)((this->m_rbBFrame).m_basis.m_el[0].m_floats + 2) = uVar4;
  uVar4 = *(undefined8 *)((rbAFrame->m_basis).m_el[1].m_floats + 2);
  *(undefined8 *)(this->m_rbBFrame).m_basis.m_el[1].m_floats =
       *(undefined8 *)(rbAFrame->m_basis).m_el[1].m_floats;
  *(undefined8 *)((this->m_rbBFrame).m_basis.m_el[1].m_floats + 2) = uVar4;
  uVar4 = *(undefined8 *)((rbAFrame->m_basis).m_el[2].m_floats + 2);
  *(undefined8 *)(this->m_rbBFrame).m_basis.m_el[2].m_floats =
       *(undefined8 *)(rbAFrame->m_basis).m_el[2].m_floats;
  *(undefined8 *)((this->m_rbBFrame).m_basis.m_el[2].m_floats + 2) = uVar4;
  uVar4 = *(undefined8 *)((rbAFrame->m_origin).m_floats + 2);
  *(undefined8 *)(this->m_rbBFrame).m_origin.m_floats = *(undefined8 *)(rbAFrame->m_origin).m_floats
  ;
  *(undefined8 *)((this->m_rbBFrame).m_origin.m_floats + 2) = uVar4;
  (this->m_limit).m_center = 0.0;
  (this->m_limit).m_halfRange = -1.0;
  (this->m_limit).m_softness = 0.9;
  (this->m_limit).m_biasFactor = 0.3;
  (this->m_limit).m_relaxationFactor = 1.0;
  (this->m_limit).m_correction = 0.0;
  (this->m_limit).m_sign = 0.0;
  (this->m_limit).m_solveLimit = false;
  this->m_angularOnly = false;
  this->m_enableAngularMotor = false;
  this->m_useSolveConstraintObsolete = false;
  this->m_useOffsetForConstraintFrame = true;
  this->m_useReferenceFrameA = useReferenceFrameA;
  this->m_flags = 0;
  this->m_normalCFM = 0.0;
  this->m_normalERP = 0.0;
  this->m_stopCFM = 0.0;
  this->m_stopERP = 0.0;
  pbVar5 = (this->super_btTypedConstraint).m_rbA;
  fVar1 = (this->m_rbAFrame).m_origin.m_floats[0];
  fVar2 = (this->m_rbAFrame).m_origin.m_floats[1];
  fVar3 = (this->m_rbAFrame).m_origin.m_floats[2];
  uVar4 = *(undefined8 *)(pbVar5->super_btCollisionObject).m_worldTransform.m_origin.m_floats;
  auVar6._4_4_ = (float)((ulong)uVar4 >> 0x20) +
                 (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[2] *
                 fVar3 + fVar1 * (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].
                                 m_floats[0] +
                         (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats
                         [1] * fVar2;
  auVar6._0_4_ = (float)uVar4 +
                 (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[2] *
                 fVar3 + fVar1 * (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].
                                 m_floats[0] +
                         (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats
                         [1] * fVar2;
  auVar6._8_4_ = (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[2] *
                 fVar3 + (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats
                         [0] * fVar1 +
                         (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats
                         [1] * fVar2 +
                 (pbVar5->super_btCollisionObject).m_worldTransform.m_origin.m_floats[2];
  auVar6._12_4_ = 0;
  *(undefined1 (*) [16])(this->m_rbBFrame).m_origin.m_floats = auVar6;
  if (CONCAT31(in_register_00000009,useReferenceFrameA) == 0) {
    bVar7 = 1.0;
  }
  else {
    bVar7 = -1.0;
  }
  this->m_referenceSign = bVar7;
  return;
}

Assistant:

btHingeConstraint::btHingeConstraint(btRigidBody& rbA, const btTransform& rbAFrame, bool useReferenceFrameA)
:btTypedConstraint(HINGE_CONSTRAINT_TYPE, rbA),m_rbAFrame(rbAFrame),m_rbBFrame(rbAFrame),
#ifdef _BT_USE_CENTER_LIMIT_
m_limit(),
#endif
m_angularOnly(false),
m_enableAngularMotor(false),
m_useSolveConstraintObsolete(HINGE_USE_OBSOLETE_SOLVER),
m_useOffsetForConstraintFrame(HINGE_USE_FRAME_OFFSET),
m_useReferenceFrameA(useReferenceFrameA),
m_flags(0),
m_normalCFM(0),
m_normalERP(0),
m_stopCFM(0),
m_stopERP(0)
{
	///not providing rigidbody B means implicitly using worldspace for body B

	m_rbBFrame.getOrigin() = m_rbA.getCenterOfMassTransform()(m_rbAFrame.getOrigin());
#ifndef	_BT_USE_CENTER_LIMIT_
	//start with free
	m_lowerLimit = btScalar(1.0f);
	m_upperLimit = btScalar(-1.0f);
	m_biasFactor = 0.3f;
	m_relaxationFactor = 1.0f;
	m_limitSoftness = 0.9f;
	m_solveLimit = false;
#endif
	m_referenceSign = m_useReferenceFrameA ? btScalar(-1.f) : btScalar(1.f);
}